

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer_factory.cc
# Opt level: O3

unique_ptr<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>_>
__thiscall
sentencepiece::TrainerFactory::Create
          (TrainerFactory *this,TrainerSpec *trainer_spec,NormalizerSpec *normalizer_spec,
          NormalizerSpec *denormalizer_spec)

{
  int iVar1;
  ostream *this_00;
  TrainerInterface *this_01;
  undefined *puVar2;
  Die local_29;
  
  switch(*(undefined4 *)(trainer_spec + 0x118)) {
  case 1:
    this_01 = (TrainerInterface *)operator_new(0x2c8);
    TrainerInterface::TrainerInterface(this_01,trainer_spec,normalizer_spec,denormalizer_spec);
    goto LAB_0014f79b;
  case 2:
    this_01 = (TrainerInterface *)operator_new(0x358);
    TrainerInterface::TrainerInterface(this_01,trainer_spec,normalizer_spec,denormalizer_spec);
    this_01->_vptr_TrainerInterface = (_func_int **)&PTR__Trainer_0027bad0;
    this_01[1]._vptr_TrainerInterface =
         (_func_int **)&this_01[1].required_chars_._M_h._M_rehash_policy._M_next_resize;
    this_01[1].required_chars_._M_h._M_buckets = (__buckets_ptr)0x1;
    this_01[1].required_chars_._M_h._M_bucket_count = 0;
    this_01[1].required_chars_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    *(undefined4 *)&this_01[1].required_chars_._M_h._M_element_count = 0x3f800000;
    *(undefined8 *)&this_01[1].required_chars_._M_h._M_rehash_policy = 0;
    this_01[1].required_chars_._M_h._M_rehash_policy._M_next_resize = 0;
    *(undefined4 *)
     &this_01[1].final_pieces_.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    this_01[1].final_pieces_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01[1].final_pieces_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this_01[1].final_pieces_;
    this_01[1].sentences_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&this_01[1].final_pieces_;
    this_01[1].sentences_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01[1].sentences_.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&this_01[1].trainer_spec_ = 0;
    *(undefined8 *)&this_01[1].field_0x78 = 0;
    *(undefined8 *)&this_01[1].field_0x80 = 0;
    *(undefined8 *)&this_01[1].field_0x88 = 0;
    *(undefined8 *)&this_01[1].field_0x90 = 0;
    goto LAB_0014f7aa;
  case 3:
    this_01 = (TrainerInterface *)operator_new(0x2c0);
    TrainerInterface::TrainerInterface(this_01,trainer_spec,normalizer_spec,denormalizer_spec);
    puVar2 = &word::Trainer::vtable;
    break;
  case 4:
    this_01 = (TrainerInterface *)operator_new(0x2c0);
    TrainerInterface::TrainerInterface(this_01,trainer_spec,normalizer_spec,denormalizer_spec);
    puVar2 = &character::Trainer::vtable;
    break;
  default:
    iVar1 = sentencepiece::logging::GetMinLogLevel();
    if (iVar1 < 4) {
      local_29.die_ = true;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"trainer_factory.cc",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"LOG(",4);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"FATAL",5);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"Unknown model_type: ",0x14);
      std::ostream::operator<<((ostream *)this_00,*(int *)(trainer_spec + 0x118));
      error::Die::~Die(&local_29);
    }
    this_01 = (TrainerInterface *)operator_new(0x2c8);
    TrainerInterface::TrainerInterface(this_01,trainer_spec,normalizer_spec,denormalizer_spec);
LAB_0014f79b:
    puVar2 = &unigram::Trainer::vtable;
  }
  this_01->_vptr_TrainerInterface = (_func_int **)(puVar2 + 0x10);
LAB_0014f7aa:
  *(TrainerInterface **)this = this_01;
  return (__uniq_ptr_data<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>,_true,_true>
          )(__uniq_ptr_data<sentencepiece::TrainerInterface,_std::default_delete<sentencepiece::TrainerInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TrainerInterface> TrainerFactory::Create(
    const TrainerSpec &trainer_spec, const NormalizerSpec &normalizer_spec,
    const NormalizerSpec &denormalizer_spec) {
  switch (trainer_spec.model_type()) {
    case TrainerSpec::UNIGRAM:
      return std::make_unique<unigram::Trainer>(trainer_spec, normalizer_spec,
                                                denormalizer_spec);
      break;
    case TrainerSpec::BPE:
      return std::make_unique<bpe::Trainer>(trainer_spec, normalizer_spec,
                                            denormalizer_spec);
      break;
    case TrainerSpec::WORD:
      return std::make_unique<word::Trainer>(trainer_spec, normalizer_spec,
                                             denormalizer_spec);
      break;
    case TrainerSpec::CHAR:
      return std::make_unique<character::Trainer>(trainer_spec, normalizer_spec,
                                                  denormalizer_spec);
      break;
    default:
      LOG(FATAL) << "Unknown model_type: " << trainer_spec.model_type();
      break;
  }

  return std::make_unique<unigram::Trainer>(trainer_spec, normalizer_spec,
                                            denormalizer_spec);
}